

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DockContextCalcDropPosForDocking
               (ImGuiWindow *target,ImGuiDockNode *target_node,ImGuiWindow *payload,
               ImGuiDir split_dir,bool split_outer,ImVec2 *out_pos)

{
  ImVec2 IVar1;
  int in_ECX;
  byte in_R8B;
  ImVec2 *in_R9;
  ImGuiDockPreviewData split_data;
  ImRect *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  ImGuiDockPreviewData *in_stack_ffffffffffffff38;
  ImGuiWindow *in_stack_ffffffffffffff40;
  ImGuiDockNode *in_stack_ffffffffffffff48;
  ImGuiWindow *in_stack_ffffffffffffff50;
  ImRect aIStack_70 [4];
  ImVec2 *local_30;
  byte local_25;
  int local_24;
  bool local_1;
  
  local_25 = in_R8B & 1;
  if (local_25 == 0) {
    local_30 = in_R9;
    local_24 = in_ECX;
    ImGuiDockPreviewData::ImGuiDockPreviewData
              ((ImGuiDockPreviewData *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
              );
    DockNodePreviewDockSetup
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37,
               (bool)in_stack_ffffffffffffff36);
    local_1 = ImRect::IsInverted(aIStack_70 + local_24);
    if (!local_1) {
      IVar1 = ImRect::GetCenter(in_stack_fffffffffffffe78);
      *local_30 = IVar1;
    }
    local_1 = !local_1;
    ImGuiDockPreviewData::~ImGuiDockPreviewData((ImGuiDockPreviewData *)0x1c7efe);
  }
  else {
    local_1 = false;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ImGui::DockContextCalcDropPosForDocking(ImGuiWindow* target, ImGuiDockNode* target_node, ImGuiWindow* payload, ImGuiDir split_dir, bool split_outer, ImVec2* out_pos)
{
    if (split_outer)
    {
        IM_ASSERT(0);
    }
    else
    {
        ImGuiDockPreviewData split_data;
        DockNodePreviewDockSetup(target, target_node, payload, &split_data, false, split_outer);
        if (split_data.DropRectsDraw[split_dir+1].IsInverted())
            return false;
        *out_pos = split_data.DropRectsDraw[split_dir+1].GetCenter();
        return true;
    }
    return false;
}